

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity_script.cxx
# Opt level: O2

void __thiscall xray_re::se_smart_cover::state_write(se_smart_cover *this,xr_packet *packet)

{
  pointer plVar1;
  pointer plVar2;
  allocator<char> local_49;
  string local_48 [32];
  
  cse_smart_cover::state_write(&this->super_cse_smart_cover,packet);
  if (0x7f < (this->super_cse_smart_cover).super_cse_alife_dynamic_object.super_cse_alife_object.
             super_cse_abstract.m_version) {
    (*packet->_vptr_xr_packet[4])(packet,&this->m_last_description);
    (*packet->_vptr_xr_packet[10])(packet,(ulong)this->m_loopholes_count);
    if (this->m_loopholes_count != '\0') {
      plVar1 = (this->m_loopholes->
               super__Vector_base<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (plVar2 = (this->m_loopholes->
                    super__Vector_base<xray_re::se_smart_cover::loophole,_std::allocator<xray_re::se_smart_cover::loophole>_>
                    )._M_impl.super__Vector_impl_data._M_start; plVar2 != plVar1;
          plVar2 = plVar2 + 1) {
        std::__cxx11::string::string<std::allocator<char>>(local_48,plVar2->id,&local_49);
        (*packet->_vptr_xr_packet[4])(packet,local_48);
        std::__cxx11::string::~string(local_48);
        (*packet->_vptr_xr_packet[0xc])(packet,(ulong)plVar2->enabled);
      }
    }
  }
  return;
}

Assistant:

void se_smart_cover::state_write(xr_packet& packet)
{
	cse_smart_cover::state_write(packet);
	if (m_version >= CSE_VERSION_0x80) {
		packet.w_sz(m_last_description);
		packet.w_u8(m_loopholes_count);

		if (m_loopholes_count > 0)
		{
			for (std::vector<loophole>::iterator it = m_loopholes->begin(), end = m_loopholes->end();
				it != end; ++it){
				packet.w_sz(it->id);
				packet.w_bool(it->enabled);
			}
		}
	}
}